

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# public_util.h
# Opt level: O0

void dukglue_call_method<NativeObject*,int,int>
               (duk_context *ctx,NativeObject **obj,char *method_name,int args,int args_1)

{
  duk_bool_t dVar1;
  int local_24;
  int args_local_1;
  int args_local;
  char *method_name_local;
  NativeObject **obj_local;
  duk_context *ctx_local;
  
  local_24 = args;
  _args_local_1 = method_name;
  method_name_local = (char *)obj;
  obj_local = (NativeObject **)ctx;
  dukglue_push<NativeObject*>(ctx,obj);
  duk_get_prop_string((duk_context *)obj_local,-1,_args_local_1);
  dVar1 = duk_check_type((duk_context *)obj_local,-1,1);
  if (dVar1 != 0) {
    duk_error_raw((duk_context *)obj_local,4,
                  "/workspace/llm4binary/github/license_c_cmakelists/Aloshi[P]dukglue/tests/../include/dukglue/public_util.h"
                  ,0x44,"Method does not exist",_args_local_1);
  }
  dVar1 = duk_is_function((duk_context *)obj_local,-1);
  if (dVar1 == 0) {
    duk_error_raw((duk_context *)obj_local,6,
                  "/workspace/llm4binary/github/license_c_cmakelists/Aloshi[P]dukglue/tests/../include/dukglue/public_util.h"
                  ,0x49,"Property is not callable");
  }
  duk_swap_top((duk_context *)obj_local,-2);
  dukglue_push<int,int>((duk_context *)obj_local,&local_24,args_1);
  duk_call_method((duk_context *)obj_local,2);
  return;
}

Assistant:

void dukglue_call_method(duk_context* ctx, const ObjT& obj, const char* method_name, ArgTs... args)
{
	dukglue_push(ctx, obj);
	duk_get_prop_string(ctx, -1, method_name);

	if (duk_check_type(ctx, -1, DUK_TYPE_UNDEFINED)) {
		duk_error(ctx, DUK_ERR_REFERENCE_ERROR, "Method does not exist", method_name);
		return;
	}

	if (!duk_is_callable(ctx, -1)) {
		duk_error(ctx, DUK_ERR_TYPE_ERROR, "Property is not callable");
		return;
	}

	duk_swap_top(ctx, -2);
	dukglue_push(ctx, args...);
	duk_call_method(ctx, sizeof...(args));
}